

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlChar * xmlSchemaWhiteSpaceReplace(xmlChar *value)

{
  byte *pbVar1;
  byte bVar2;
  xmlChar *pxVar3;
  long lVar4;
  byte *pbVar5;
  xmlChar *cur;
  
  if (value == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar4 = 0;
  while (bVar2 = value[lVar4], 1 < bVar2 - 9) {
    if (bVar2 == 0) {
      return (xmlChar *)0x0;
    }
    if (bVar2 == 0xd) break;
    lVar4 = lVar4 + 1;
  }
  pxVar3 = xmlStrdup(value);
  pbVar5 = pxVar3 + lVar4;
  do {
    if ((*pbVar5 < 0xe) && ((0x2600U >> (*pbVar5 & 0x1f) & 1) != 0)) {
      *pbVar5 = 0x20;
    }
    pbVar1 = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  } while (*pbVar1 != 0);
  return pxVar3;
}

Assistant:

xmlChar *
xmlSchemaWhiteSpaceReplace(const xmlChar *value) {
    const xmlChar *cur = value;
    xmlChar *ret = NULL, *mcur;

    if (value == NULL)
	return(NULL);

    while ((*cur != 0) &&
	(((*cur) != 0xd) && ((*cur) != 0x9) && ((*cur) != 0xa))) {
	cur++;
    }
    if (*cur == 0)
	return (NULL);
    ret = xmlStrdup(value);
    /* TODO FIXME: I guess gcc will bark at this. */
    mcur = (xmlChar *)  (ret + (cur - value));
    do {
	if ( ((*mcur) == 0xd) || ((*mcur) == 0x9) || ((*mcur) == 0xa) )
	    *mcur = ' ';
	mcur++;
    } while (*mcur != 0);
    return(ret);
}